

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor.c
# Opt level: O1

size_t add_pair(pExecutor exec)

{
  ulong uVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  bool bVar5;
  
  uVar1 = exec->atomsCount;
  if (uVar1 == 0) {
LAB_00108fe7:
    bVar5 = true;
    uVar3 = 0x7fffffff;
  }
  else {
    if ((*exec->pairsFlags & GC_USED) == GC_NONE) {
      bVar5 = true;
      uVar3 = 0;
    }
    else {
      uVar4 = 0;
      do {
        if (uVar1 - 1 == uVar4) goto LAB_00108fe7;
        uVar3 = uVar4 + 1;
        lVar2 = uVar4 + 1;
        uVar4 = uVar3;
      } while ((exec->pairsFlags[lVar2] & GC_USED) != GC_NONE);
      bVar5 = uVar3 < uVar1;
    }
    if (!bVar5) goto LAB_00108fe7;
    bVar5 = false;
  }
  if (!bVar5) goto LAB_00109057;
  gc_collect(exec);
  uVar1 = exec->atomsCount;
  if (uVar1 == 0) {
LAB_00109039:
    bVar5 = true;
    uVar3 = 0x7fffffff;
  }
  else {
    if ((*exec->pairsFlags & GC_USED) == GC_NONE) {
      bVar5 = true;
      uVar3 = 0;
    }
    else {
      uVar4 = 0;
      do {
        if (uVar1 - 1 == uVar4) goto LAB_00109039;
        uVar3 = uVar4 + 1;
        lVar2 = uVar4 + 1;
        uVar4 = uVar3;
      } while ((exec->pairsFlags[lVar2] & GC_USED) != GC_NONE);
      bVar5 = uVar3 < uVar1;
    }
    if (!bVar5) goto LAB_00109039;
    bVar5 = false;
  }
  if (bVar5) {
    puts("add_pair: out of memory");
    return 0x7fffffff;
  }
LAB_00109057:
  exec->pairsFlags[uVar3] = GC_USED;
  return uVar3;
}

Assistant:

size_t add_pair(pExecutor exec)
{
    size_t place;
    int res = find_place_for_pair(exec, &place);
    if (res == FIND_PLACE_ERROR)
    {
        // free unused memory and try again
        gc_collect(exec);
        res = find_place_for_pair(exec, &place);
        if (res == FIND_PLACE_ERROR)
        {
            log("add_pair: out of memory");
            return EXPR_ERROR;
        }
    }
    exec->pairsFlags[place] = GC_USED;
    return place;
}